

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O0

MPP_RET hal_h264e_vepu541_start(void *hal,HalEncTask *task)

{
  long local_48;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  HalH264eVepu541Ctx *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter %p\n","hal_h264e_vepu541_start",hal);
  }
  rd_cfg._8_8_ = (long)hal + 0x500;
  ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
  if (ctx._4_4_ == MPP_OK) {
    rd_cfg._8_8_ = (long)hal + 0x1b8;
    ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),4,&rd_cfg.size);
    if (ctx._4_4_ == MPP_OK) {
      local_48 = (long)hal + 0x80c;
      rd_cfg.reg._0_4_ = 4;
      rd_cfg.reg._4_4_ = 0x1c;
      ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,&local_48);
      if (ctx._4_4_ == MPP_OK) {
        local_48 = (long)hal + 0x810;
        rd_cfg.reg._0_4_ = 0x134;
        rd_cfg.reg._4_4_ = 0x210;
        ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),5,&local_48);
        if (ctx._4_4_ == MPP_OK) {
          ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0xf,(void *)0x0);
          if (ctx._4_4_ != MPP_OK) {
            _mpp_log_l(2,"hal_h264e_vepu541","send cmd failed %d\n","hal_h264e_vepu541_start",
                       (ulong)(uint)ctx._4_4_);
          }
        }
        else {
          _mpp_log_l(2,"hal_h264e_vepu541","set register read failed %d\n","hal_h264e_vepu541_start"
                     ,(ulong)(uint)ctx._4_4_);
        }
      }
      else {
        _mpp_log_l(2,"hal_h264e_vepu541","set register read failed %d\n","hal_h264e_vepu541_start",
                   (ulong)(uint)ctx._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu541","set register write failed %d\n","hal_h264e_vepu541_start",
                 (ulong)(uint)ctx._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_h264e_vepu541","set register write failed %d\n","hal_h264e_vepu541_start",
               (ulong)(uint)ctx._4_4_);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave %p\n","hal_h264e_vepu541_start",hal);
  }
  return ctx._4_4_;
}

Assistant:

static MPP_RET hal_h264e_vepu541_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepu541Ctx *ctx = (HalH264eVepu541Ctx *)hal;

    (void) task;

    hal_h264e_dbg_func("enter %p\n", hal);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        /* write L2 registers */
        wr_cfg.reg = &ctx->regs_l2_set;
        wr_cfg.size = sizeof(Vepu541H264eRegL2Set);
        wr_cfg.offset = VEPU541_REG_BASE_L2;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        /* write L1 registers */
        wr_cfg.reg = &ctx->regs_set;
        wr_cfg.size = sizeof(Vepu541H264eRegSet);
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        /* set output request */
        rd_cfg.reg = &ctx->regs_ret.hw_status;
        rd_cfg.size = sizeof(RK_U32);
        rd_cfg.offset = VEPU541_REG_BASE_HW_STATUS;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &ctx->regs_ret.st_bsl;
        rd_cfg.size = sizeof(ctx->regs_ret) - 4;
        rd_cfg.offset = VEPU541_REG_BASE_STATISTICS;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        /* send request to hardware */
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_h264e_dbg_func("leave %p\n", hal);

    return ret;
}